

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

string * __thiscall
QPDF::compute_encryption_key_from_password
          (string *__return_storage_ptr__,QPDF *this,string *password,EncryptionData *data)

{
  unsigned_long uVar1;
  int iVar2;
  MD5 md5;
  int key_len;
  Digest digest;
  char pbytes [4];
  unsigned_long local_20;
  
  MD5::MD5(&md5,(uchar *)this,(size_t)password,(uchar *)data);
  pad_or_truncate_password_V4((string *)digest,(string *)this);
  MD5::encodeDataIncrementally(&md5,(char *)CONCAT44(digest._4_4_,digest._0_4_),0x20);
  std::__cxx11::string::~string((string *)digest);
  MD5::encodeDataIncrementally(&md5,(char *)(password->field_2)._M_allocated_capacity,0x20);
  pbytes = *(char (*) [4])((long)&password->_M_string_length + 4);
  MD5::encodeDataIncrementally(&md5,pbytes,4);
  MD5::encodeDataIncrementally
            (&md5,(char *)password[5].field_2._M_allocated_capacity,
             *(size_t *)((long)&password[5].field_2 + 8));
  if ((3 < *(int *)((long)&(password->_M_dataplus)._M_p + 4)) &&
     (password[6].field_2._M_local_buf[0] == '\0')) {
    digest[0] = 0xff;
    digest[1] = 0xff;
    digest[2] = 0xff;
    digest[3] = 0xff;
    MD5::encodeDataIncrementally(&md5,(char *)digest,4);
  }
  local_20 = 0x10;
  key_len = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert(&local_20);
  iVar2 = (int)password->_M_string_length;
  if (iVar2 < key_len) {
    key_len = iVar2;
  }
  iVar2 = 0x32;
  if (*(int *)((long)&(password->_M_dataplus)._M_p + 4) < 3) {
    iVar2 = 0;
  }
  iterate_md5_digest(&md5,&digest,iVar2,key_len);
  uVar1 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&key_len);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,digest,digest + uVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF::compute_encryption_key_from_password(std::string const& password, EncryptionData const& data)
{
    // Algorithm 3.2 from the PDF 1.7 Reference Manual

    // This code does not properly handle Unicode passwords. Passwords are supposed to be converted
    // from OS codepage characters to PDFDocEncoding.  Unicode passwords are supposed to be
    // converted to OS codepage before converting to PDFDocEncoding.  We instead require the
    // password to be presented in its final form.

    MD5 md5;
    md5.encodeDataIncrementally(pad_or_truncate_password_V4(password).c_str(), key_bytes);
    md5.encodeDataIncrementally(data.getO().c_str(), key_bytes);
    char pbytes[4];
    int P = data.getP();
    pbytes[0] = static_cast<char>(P & 0xff);
    pbytes[1] = static_cast<char>((P >> 8) & 0xff);
    pbytes[2] = static_cast<char>((P >> 16) & 0xff);
    pbytes[3] = static_cast<char>((P >> 24) & 0xff);
    md5.encodeDataIncrementally(pbytes, 4);
    md5.encodeDataIncrementally(data.getId1().c_str(), data.getId1().length());
    if ((data.getR() >= 4) && (!data.getEncryptMetadata())) {
        char bytes[4];
        memset(bytes, 0xff, 4);
        md5.encodeDataIncrementally(bytes, 4);
    }
    MD5::Digest digest;
    int key_len = std::min(toI(sizeof(digest)), data.getLengthBytes());
    iterate_md5_digest(md5, digest, ((data.getR() >= 3) ? 50 : 0), key_len);
    return {reinterpret_cast<char*>(digest), toS(key_len)};
}